

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void tcpkeepalive(SessionHandle *data,curl_socket_t sockfd)

{
  int iVar1;
  uint local_18;
  uint local_14;
  int optval;
  curl_socket_t sockfd_local;
  SessionHandle *data_local;
  
  local_18 = (uint)(((data->set).tcp_keepalive & 1U) != 0);
  local_14 = sockfd;
  _optval = data;
  iVar1 = setsockopt(sockfd,1,9,&local_18,4);
  if (iVar1 < 0) {
    Curl_infof(_optval,"Failed to set SO_KEEPALIVE on fd %d\n",(ulong)local_14);
  }
  else {
    local_18 = curlx_sltosi((_optval->set).tcp_keepidle);
    iVar1 = setsockopt(local_14,6,4,&local_18,4);
    if (iVar1 < 0) {
      Curl_infof(_optval,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)local_14);
    }
    local_18 = curlx_sltosi((_optval->set).tcp_keepintvl);
    iVar1 = setsockopt(local_14,6,5,&local_18,4);
    if (iVar1 < 0) {
      Curl_infof(_optval,"Failed to set TCP_KEEPINTVL on fd %d\n",(ulong)local_14);
    }
  }
  return;
}

Assistant:

static void
tcpkeepalive(struct SessionHandle *data,
             curl_socket_t sockfd)
{
  int optval = data->set.tcp_keepalive?1:0;

  /* only set IDLE and INTVL if setting KEEPALIVE is successful */
  if(setsockopt(sockfd, SOL_SOCKET, SO_KEEPALIVE,
        (void *)&optval, sizeof(optval)) < 0) {
    infof(data, "Failed to set SO_KEEPALIVE on fd %d\n", sockfd);
  }
  else {
#if defined(SIO_KEEPALIVE_VALS)
    struct tcp_keepalive vals;
    DWORD dummy;
    vals.onoff = 1;
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    vals.keepalivetime = optval;
    optval = curlx_sltosi(data->set.tcp_keepintvl);
    KEEPALIVE_FACTOR(optval);
    vals.keepaliveinterval = optval;
    if(WSAIoctl(sockfd, SIO_KEEPALIVE_VALS, (LPVOID) &vals, sizeof(vals),
                NULL, 0, &dummy, NULL, NULL) != 0) {
      infof(data, "Failed to set SIO_KEEPALIVE_VALS on fd %d: %d\n",
            (int)sockfd, WSAGetLastError());
    }
#else
#ifdef TCP_KEEPIDLE
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPIDLE,
          (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPIDLE on fd %d\n", sockfd);
    }
#endif
#ifdef TCP_KEEPINTVL
    optval = curlx_sltosi(data->set.tcp_keepintvl);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPINTVL,
          (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPINTVL on fd %d\n", sockfd);
    }
#endif
#ifdef TCP_KEEPALIVE
    /* Mac OS X style */
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPALIVE,
          (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPALIVE on fd %d\n", sockfd);
    }
#endif
#endif
  }
}